

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_SetOption
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *optionName,void *value)

{
  char **destination;
  char **destination_00;
  int iVar1;
  int *piVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_CLIENT_RESULT IVar4;
  char *pcVar5;
  char *tempCopy;
  
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar5 = 
    "invalid argument detected: IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle=%p, const char* optionName=%s, const void* value=%p"
    ;
    iVar1 = 0x4e7;
LAB_00127dfa:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
              ,"IoTHubClient_LL_UploadToBlob_SetOption",iVar1,1,pcVar5);
  }
  else {
    iVar1 = strcmp(optionName,"x509certificate");
    if (iVar1 == 0) {
      if ((handle->cred_type & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) == IOTHUB_CREDENTIAL_TYPE_X509) {
        iVar1 = mallocAndStrcpy_s(&tempCopy,(char *)value);
        if (iVar1 == 0) {
          free((handle->credentials).x509_credentials.x509certificate);
          (handle->credentials).x509_credentials.x509certificate = tempCopy;
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar4 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar5 = "unable to mallocAndStrcpy_s";
        iVar1 = 0x4fb;
        goto LAB_00127dfa;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "trying to set a x509 certificate while the authentication scheme is not x509";
        iVar1 = 0x4f2;
        goto LAB_00127df7;
      }
    }
    else {
      iVar1 = strcmp(optionName,"x509privatekey");
      if (iVar1 == 0) {
        if ((handle->cred_type & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) == IOTHUB_CREDENTIAL_TYPE_X509)
        {
          iVar1 = mallocAndStrcpy_s(&tempCopy,(char *)value);
          if (iVar1 == 0) {
            free((handle->credentials).x509_credentials.x509privatekey);
            (handle->credentials).x509_credentials.x509privatekey = tempCopy;
            return IOTHUB_CLIENT_OK;
          }
          p_Var3 = xlogging_get_log_function();
          IVar4 = IOTHUB_CLIENT_ERROR;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return IOTHUB_CLIENT_ERROR;
          }
          pcVar5 = "unable to mallocAndStrcpy_s";
          iVar1 = 0x516;
          goto LAB_00127dfa;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "trying to set a x509 privatekey while the authentication scheme is not x509";
          iVar1 = 0x50d;
          goto LAB_00127df7;
        }
      }
      else {
        iVar1 = strcmp("x509PrivatekeyType",optionName);
        if (iVar1 == 0) {
          if ((handle->cred_type & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) ==
              IOTHUB_CREDENTIAL_TYPE_X509) {
            if (value != (void *)0x0) {
              piVar2 = (int *)malloc(4);
              if (piVar2 != (int *)0x0) {
                *piVar2 = *value;
                free((handle->credentials).x509_credentials.x509privatekeyType);
                (handle->credentials).x509_credentials.x509privatekeyType = piVar2;
                return IOTHUB_CLIENT_OK;
              }
              p_Var3 = xlogging_get_log_function();
              IVar4 = IOTHUB_CLIENT_ERROR;
              if (p_Var3 == (LOGGER_LOG)0x0) {
                return IOTHUB_CLIENT_ERROR;
              }
              pcVar5 = "failure in malloc";
              iVar1 = 0x535;
              goto LAB_00127dfa;
            }
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar5 = "NULL is a not a valid value for x509 private key type";
              iVar1 = 0x52d;
              goto LAB_00127df7;
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar5 = 
              "trying to set a x509 private key type while the authentication scheme is not x509";
              iVar1 = 0x528;
LAB_00127df7:
              IVar4 = IOTHUB_CLIENT_INVALID_ARG;
              goto LAB_00127dfa;
            }
          }
        }
        else {
          iVar1 = strcmp("Engine",optionName);
          if (iVar1 == 0) {
            if ((handle->cred_type & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) ==
                IOTHUB_CREDENTIAL_TYPE_X509) {
              iVar1 = mallocAndStrcpy_s(&tempCopy,(char *)value);
              if (iVar1 == 0) {
                free((handle->credentials).x509_credentials.engine);
                (handle->credentials).x509_credentials.engine = tempCopy;
                return IOTHUB_CLIENT_OK;
              }
              p_Var3 = xlogging_get_log_function();
              IVar4 = IOTHUB_CLIENT_ERROR;
              if (p_Var3 == (LOGGER_LOG)0x0) {
                return IOTHUB_CLIENT_ERROR;
              }
              pcVar5 = "failure in mallocAndStrcpy_s";
              iVar1 = 0x550;
              goto LAB_00127dfa;
            }
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar5 = "trying to set an openssl engine while the authentication scheme is not x509"
              ;
              iVar1 = 0x548;
              goto LAB_00127df7;
            }
          }
          else {
            iVar1 = strcmp("TrustedCerts",optionName);
            if (iVar1 == 0) {
              if (value != (void *)0x0) {
                iVar1 = mallocAndStrcpy_s(&tempCopy,(char *)value);
                if (iVar1 == 0) {
                  free(handle->certificates);
                  handle->certificates = tempCopy;
                  return IOTHUB_CLIENT_OK;
                }
                p_Var3 = xlogging_get_log_function();
                IVar4 = IOTHUB_CLIENT_ERROR;
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  return IOTHUB_CLIENT_ERROR;
                }
                pcVar5 = "failure in mallocAndStrcpy_s";
                iVar1 = 0x56a;
                goto LAB_00127dfa;
              }
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar5 = "NULL is a not a valid value for TrustedCerts";
                iVar1 = 0x562;
                goto LAB_00127df7;
              }
            }
            else {
              iVar1 = strcmp(optionName,"proxy_data");
              if (iVar1 == 0) {
                if (*value != 0) {
                  if (*(long *)((long)value + 0x10) == 0) {
                    if (*(long *)((long)value + 0x18) != 0) goto LAB_00127d4e;
                  }
                  else if (*(long *)((long)value + 0x18) == 0) {
LAB_00127d4e:
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      pcVar5 = "Only one of username and password for proxy settings was NULL";
                      iVar1 = 0x584;
                      goto LAB_00127df7;
                    }
                    goto LAB_00127e0f;
                  }
                  pcVar5 = (handle->http_proxy_options).host_address;
                  if (pcVar5 != (char *)0x0) {
                    free(pcVar5);
                    (handle->http_proxy_options).host_address = (char *)0x0;
                  }
                  destination = &(handle->http_proxy_options).username;
                  pcVar5 = (handle->http_proxy_options).username;
                  if (pcVar5 != (char *)0x0) {
                    free(pcVar5);
                    *destination = (char *)0x0;
                  }
                  destination_00 = &(handle->http_proxy_options).password;
                  pcVar5 = (handle->http_proxy_options).password;
                  if (pcVar5 != (char *)0x0) {
                    free(pcVar5);
                    *destination_00 = (char *)0x0;
                  }
                  (handle->http_proxy_options).port = *(int *)((long)value + 8);
                  iVar1 = mallocAndStrcpy_s(&(handle->http_proxy_options).host_address,*value);
                  if (iVar1 == 0) {
                    if ((*(char **)((long)value + 0x10) == (char *)0x0) ||
                       (iVar1 = mallocAndStrcpy_s(destination,*(char **)((long)value + 0x10)),
                       iVar1 == 0)) {
                      if (*(char **)((long)value + 0x18) == (char *)0x0) {
                        return IOTHUB_CLIENT_OK;
                      }
                      iVar1 = mallocAndStrcpy_s(destination_00,*(char **)((long)value + 0x18));
                      if (iVar1 == 0) {
                        return IOTHUB_CLIENT_OK;
                      }
                      p_Var3 = xlogging_get_log_function();
                      IVar4 = IOTHUB_CLIENT_ERROR;
                      if (p_Var3 == (LOGGER_LOG)0x0) {
                        return IOTHUB_CLIENT_ERROR;
                      }
                      pcVar5 = 
                      "failure in mallocAndStrcpy_s - upload_data->http_proxy_options.password";
                      iVar1 = 0x5a7;
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      IVar4 = IOTHUB_CLIENT_ERROR;
                      if (p_Var3 == (LOGGER_LOG)0x0) {
                        return IOTHUB_CLIENT_ERROR;
                      }
                      pcVar5 = 
                      "failure in mallocAndStrcpy_s - upload_data->http_proxy_options.username";
                      iVar1 = 0x5a2;
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    IVar4 = IOTHUB_CLIENT_ERROR;
                    if (p_Var3 == (LOGGER_LOG)0x0) {
                      return IOTHUB_CLIENT_ERROR;
                    }
                    pcVar5 = 
                    "failure in mallocAndStrcpy_s - upload_data->http_proxy_options.host_address";
                    iVar1 = 0x59d;
                  }
                  goto LAB_00127dfa;
                }
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar5 = "NULL host_address in proxy options";
                  iVar1 = 0x57e;
                  goto LAB_00127df7;
                }
              }
              else {
                iVar1 = strcmp(optionName,"CURLOPT_VERBOSE");
                if (iVar1 == 0) {
                  handle->curl_verbosity_level = (*value == '\0') + UPLOADTOBLOB_CURL_VERBOSITY_ON;
                  return IOTHUB_CLIENT_OK;
                }
                iVar1 = strcmp(optionName,"blob_upload_timeout_secs");
                if (iVar1 == 0) {
                  handle->blob_upload_timeout_millisecs = *value * 1000;
                  return IOTHUB_CLIENT_OK;
                }
                iVar1 = strcmp(optionName,"network_interface_upload_to_blob");
                if (iVar1 == 0) {
                  if (value != (void *)0x0) {
                    iVar1 = mallocAndStrcpy_s(&tempCopy,(char *)value);
                    if (iVar1 == 0) {
                      free(handle->networkInterface);
                      handle->networkInterface = tempCopy;
                      return IOTHUB_CLIENT_OK;
                    }
                    p_Var3 = xlogging_get_log_function();
                    IVar4 = IOTHUB_CLIENT_ERROR;
                    if (p_Var3 == (LOGGER_LOG)0x0) {
                      return IOTHUB_CLIENT_ERROR;
                    }
                    pcVar5 = "failure in mallocAndStrcpy_s";
                    iVar1 = 0x5c6;
                    goto LAB_00127dfa;
                  }
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    pcVar5 = "NULL is not a valid value for networkInterface option";
                    iVar1 = 0x5be;
                    goto LAB_00127df7;
                  }
                }
                else {
                  iVar1 = strcmp(optionName,"blob_upload_tls_renegotiation");
                  if (iVar1 == 0) {
                    handle->tls_renegotiation = *value;
                    return IOTHUB_CLIENT_OK;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00127e0f:
    IVar4 = IOTHUB_CLIENT_INVALID_ARG;
  }
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_SetOption(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* optionName, const void* value)
{
    IOTHUB_CLIENT_RESULT result;
    if (handle == NULL)
    {
        LogError("invalid argument detected: IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle=%p, const char* optionName=%s, const void* value=%p", handle, optionName, value);
        result = IOTHUB_CLIENT_ERROR;
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (strcmp(optionName, OPTION_X509_CERT) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set a x509 certificate while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                /*try to make a copy of the certificate*/
                char* temp;
                if (mallocAndStrcpy_s(&temp, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->credentials.x509_credentials.x509certificate != NULL) /*free any previous values, if any*/
                    {
                        free(upload_data->credentials.x509_credentials.x509certificate);
                    }
                    upload_data->credentials.x509_credentials.x509certificate = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_X509_PRIVATE_KEY) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set a x509 privatekey while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                /*try to make a copy of the privatekey*/
                char* temp;
                if (mallocAndStrcpy_s(&temp, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->credentials.x509_credentials.x509privatekey != NULL) /*free any previous values, if any*/
                    {
                        free(upload_data->credentials.x509_credentials.x509privatekey);
                    }
                    upload_data->credentials.x509_credentials.x509privatekey = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set a x509 private key type while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (value == NULL)
            {
                LogError("NULL is a not a valid value for x509 private key type");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                int* temp = malloc(sizeof(int));
                if (temp == NULL)
                {
                    LogError("failure in malloc");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    *temp = *(int*)value;
                    if (upload_data->credentials.x509_credentials.x509privatekeyType != NULL)
                    {
                        free(upload_data->credentials.x509_credentials.x509privatekeyType);
                    }
                    upload_data->credentials.x509_credentials.x509privatekeyType = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            if (upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && upload_data->cred_type != IOTHUB_CREDENTIAL_TYPE_X509_ECC)
            {
                LogError("trying to set an openssl engine while the authentication scheme is not x509");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* temp;
                if (mallocAndStrcpy_s(&temp, value) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->credentials.x509_credentials.engine != NULL)
                    {
                        free(upload_data->credentials.x509_credentials.engine);
                    }
                    upload_data->credentials.x509_credentials.engine = temp;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(OPTION_TRUSTED_CERT, optionName) == 0)
        {
            if (value == NULL)
            {
                LogError("NULL is a not a valid value for TrustedCerts");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* tempCopy;
                if (mallocAndStrcpy_s(&tempCopy, value) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->certificates != NULL)
                    {
                        free(upload_data->certificates);
                    }
                    upload_data->certificates = tempCopy;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_HTTP_PROXY) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_options = (HTTP_PROXY_OPTIONS *)value;

            if (proxy_options->host_address == NULL)
            {
                LogError("NULL host_address in proxy options");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (((proxy_options->username == NULL) || (proxy_options->password == NULL)) &&
                (proxy_options->username != proxy_options->password))
            {
                LogError("Only one of username and password for proxy settings was NULL");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                if (upload_data->http_proxy_options.host_address != NULL)
                {
                    free((char *)upload_data->http_proxy_options.host_address);
                    upload_data->http_proxy_options.host_address = NULL;
                }
                if (upload_data->http_proxy_options.username != NULL)
                {
                    free((char *)upload_data->http_proxy_options.username);
                    upload_data->http_proxy_options.username = NULL;
                }
                if (upload_data->http_proxy_options.password != NULL)
                {
                    free((char *)upload_data->http_proxy_options.password);
                    upload_data->http_proxy_options.password = NULL;
                }

                upload_data->http_proxy_options.port = proxy_options->port;

                if (mallocAndStrcpy_s((char **)(&upload_data->http_proxy_options.host_address), proxy_options->host_address) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s - upload_data->http_proxy_options.host_address");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if (proxy_options->username != NULL && mallocAndStrcpy_s((char **)(&upload_data->http_proxy_options.username), proxy_options->username) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s - upload_data->http_proxy_options.username");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if (proxy_options->password != NULL && mallocAndStrcpy_s((char **)(&upload_data->http_proxy_options.password), proxy_options->password) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s - upload_data->http_proxy_options.password");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_CURL_VERBOSE) == 0)
        {
            upload_data->curl_verbosity_level = ((*(bool*)value) == 0) ? UPLOADTOBLOB_CURL_VERBOSITY_OFF : UPLOADTOBLOB_CURL_VERBOSITY_ON;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(optionName, OPTION_BLOB_UPLOAD_TIMEOUT_SECS) == 0)
        {
            upload_data->blob_upload_timeout_millisecs = 1000 * (*(size_t*)value);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(optionName, OPTION_NETWORK_INTERFACE_UPLOAD_TO_BLOB) == 0)
        {
            if (value == NULL)
            {
                LogError("NULL is not a valid value for networkInterface option");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* tempCopy;
                if (mallocAndStrcpy_s(&tempCopy, value) != 0)
                {
                    LogError("failure in mallocAndStrcpy_s");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (upload_data->networkInterface != NULL)
                    {
                        free((char*)upload_data->networkInterface);
                    }
                    upload_data->networkInterface = tempCopy;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else if (strcmp(optionName, OPTION_BLOB_UPLOAD_TLS_RENEGOTIATION) == 0)
        {
            upload_data->tls_renegotiation = *((bool*)(value));
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
    }
    return result;
}